

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initest.c
# Opt level: O3

void ywalg2(double *x,int N,int p,double *phi,double *var)

{
  ulong uVar1;
  bool bVar2;
  uint M;
  double *acov;
  double *B;
  void *__src;
  double *A;
  double *C;
  double *pdVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double *pdVar8;
  double dVar9;
  double local_38;
  
  M = p + 1;
  acov = (double *)malloc((long)(int)M * 8);
  B = (double *)malloc((long)(int)M * 8);
  __src = malloc((long)p * 8);
  A = (double *)malloc((long)p * 8);
  C = (double *)malloc(8);
  autocovar(x,N,acov,M);
  dVar9 = *acov;
  *var = dVar9;
  *acov = 1.0;
  if (p < 1) {
    *B = -acov[1];
  }
  else {
    uVar4 = 1;
    do {
      acov[uVar4] = acov[uVar4] / dVar9;
      uVar4 = uVar4 + 1;
    } while (M != uVar4);
    dVar9 = -acov[1];
    *B = dVar9;
    if (p != 1) {
      lVar7 = 1;
      local_38 = 1.0;
      uVar4 = 0;
      pdVar8 = B;
      do {
        local_38 = (1.0 - dVar9 * dVar9) * local_38;
        pdVar3 = A;
        lVar6 = lVar7;
        do {
          *pdVar3 = acov[lVar6];
          pdVar3 = pdVar3 + 1;
          lVar5 = lVar6 + -1;
          bVar2 = 0 < lVar6;
          lVar6 = lVar5;
        } while (lVar5 != 0 && bVar2);
        uVar1 = uVar4 + 1;
        mmult(A,B,C,1,(int)uVar1,1);
        dVar9 = -(*C + acov[uVar4 + 2]) / local_38;
        lVar6 = 0;
        pdVar3 = pdVar8;
        do {
          *(double *)((long)__src + lVar6 * 8) = *pdVar3 * dVar9 + B[lVar6];
          lVar6 = lVar6 + 1;
          pdVar3 = pdVar3 + -1;
        } while (lVar7 != lVar6);
        memcpy(B,__src,uVar4 * 8 + 8);
        B[uVar1] = dVar9;
        lVar7 = lVar7 + 1;
        pdVar8 = pdVar8 + 1;
        uVar4 = uVar1;
      } while (uVar1 != p - 1);
    }
    uVar4 = 0;
    do {
      phi[uVar4] = -B[uVar4];
      uVar4 = uVar4 + 1;
    } while ((uint)p != uVar4);
  }
  mmult(acov + 1,phi,C,1,p,1);
  *var = (1.0 - *C) * *var;
  free(acov);
  free(__src);
  free(B);
  free(A);
  free(C);
  return;
}

Assistant:

void ywalg2(double *x, int N, int p, double *phi,double *var) {
	int lag, k, j;
	double *acf, *z, *y, *temp1, *temp2;
	double a, b;
	// Same as ywalg except it also returns the variance value
	lag = p + 1;
	acf = (double*)malloc(sizeof(double)* lag);
	y = (double*)malloc(sizeof(double)* lag);
	z = (double*)malloc(sizeof(double)* p);
	temp1 = (double*)malloc(sizeof(double)* p);
	temp2 = (double*)malloc(sizeof(double)* 1);

	autocovar(x, N, acf, lag);
	*var = acf[0];
	acf[0] = 1.0;
	for (k = 1; k < lag; ++k) {
		acf[k] = acf[k] / *var;
	}
	b = acf[0];
	a = y[0] = -acf[1];

	for (k = 0; k < p - 1; ++k) {
		b = (1 - a*a) * b;
		for (j = k; j >= 0; --j) {
			temp1[k - j] = acf[j + 1];
		}
		mmult(temp1, y, temp2, 1, k + 1, 1);

		a = -(*temp2 + acf[k + 2]) / b;

		for (j = 0; j <= k; ++j) {
			z[j] = y[j] + a * y[k - j];
		}

		for (j = 0; j <= k; ++j) {
			y[j] = z[j];
		}
		y[k + 1] = a;

	}

	for (j = 0; j < p; ++j) {
		phi[j] = -1.0 * y[j];
	}
	mmult(acf + 1, phi, temp2, 1, p, 1);
	*var = *var * (1.0 - *temp2);

	free(acf);
	free(z);
	free(y);
	free(temp1);
	free(temp2);
}